

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O0

void __thiscall QStringMatcher::setPattern(QStringMatcher *this,QString *pattern)

{
  long lVar1;
  QString *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringMatcher *this_00;
  QStringView *this_01;
  storage_type_conflict *local_18;
  Data *pDStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QStringMatcher *)(in_RDI + 1);
  this_01 = in_RDI;
  QString::operator=((QString *)in_RDI,(QString *)this_00);
  QStringView::QStringView<QString,_true>(this_01,in_RSI);
  in_RDI[2].m_data = local_18;
  ((DataPointer *)&in_RDI[3].m_size)->d = pDStack_10;
  updateSkipTable(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStringMatcher::setPattern(const QString &pattern)
{
    q_pattern = pattern;
    q_sv = q_pattern;
    updateSkipTable();
}